

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData256 *
cfd::core::CryptoUtil::HmacSha256(ByteData256 *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::GetBytes(&local_30,key);
  HmacSha256(__return_storage_ptr__,&local_30,data);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::HmacSha256(const ByteData &key, const ByteData &data) {
  return HmacSha256(key.GetBytes(), data);
}